

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.cpp
# Opt level: O1

int PAL_vsscanf(LPCSTR Buffer,LPCSTR Format,__va_list_tag *ap)

{
  byte bVar1;
  uint uVar2;
  LPWSTR lpWideCharStr;
  undefined8 uVar3;
  FILE *__stream;
  byte bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  errno_t eVar8;
  DWORD DVar9;
  size_t sVar10;
  byte *__nptr;
  undefined8 *puVar11;
  int iVar12;
  byte *pbVar13;
  byte *pbVar14;
  int iVar15;
  ulong uVar16;
  byte *pbVar17;
  ulong uVar18;
  byte *string;
  byte *pbVar19;
  ulong uVar20;
  long in_FS_OFFSET;
  bool bVar21;
  int local_478;
  int local_464;
  __va_list_tag *p_Stack_460;
  int n;
  uint local_454;
  ulong local_450;
  ulong local_448;
  int local_43c;
  byte local_438;
  byte local_437 [7];
  CHAR TempBuff [1024];
  
  TempBuff._1016_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  bVar4 = *Format;
  if (bVar4 == 0) {
    iVar6 = 0;
  }
  else {
    iVar6 = 0;
    local_450 = 0xffffffff;
    string = (byte *)Buffer;
    p_Stack_460 = ap;
    do {
      if ((*string == 0) && (iVar6 == 0)) goto LAB_00316234;
      iVar5 = isspace((uint)bVar4);
      if (iVar5 != 0) {
        string = string + -1;
        do {
          pbVar14 = string + 1;
          string = string + 1;
          iVar5 = isspace((uint)*pbVar14);
        } while (iVar5 != 0);
        goto LAB_00315eeb;
      }
      if (*Format != 0x25) goto LAB_00315ecd;
      pbVar14 = (byte *)Format + 1;
      local_438 = *Format;
      sVar10 = strlen((char *)pbVar14);
      __nptr = (byte *)PAL_malloc(sVar10 + 1);
      if (__nptr == (byte *)0x0) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0031625e;
        SetLastError(8);
        local_454 = 1;
        iVar5 = -1;
        uVar16 = 0xffffffff;
LAB_0031563b:
        bVar21 = true;
        uVar18 = 0xffffffff;
        Format = (LPCSTR)pbVar14;
        goto LAB_00315ebf;
      }
      pbVar19 = local_437;
      pbVar13 = pbVar14;
      if (*pbVar14 == 0x2a) {
        pbVar13 = (byte *)Format + 2;
        pbVar19 = local_437 + 1;
        local_437[0] = 0x2a;
      }
      local_454 = (uint)(*pbVar14 != 0x2a);
      local_43c = iVar6;
      iVar6 = isdigit((uint)*pbVar13);
      if (iVar6 != 0) {
        iVar6 = isdigit((uint)*pbVar13);
        pbVar14 = __nptr;
        while (Format = (LPCSTR)pbVar13, iVar6 != 0) {
          *pbVar14 = *pbVar13;
          if ((pbVar19 < &local_438) || (TempBuff + 0x3f8 <= pbVar19)) {
            SetLastError(0x7a);
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_0031625e;
            bVar21 = true;
            uVar18 = 0xffffffff;
            uVar16 = 0xffffffff;
            iVar6 = local_43c;
            iVar5 = -1;
            goto LAB_00315ebf;
          }
          pbVar14 = pbVar14 + 1;
          *pbVar19 = *pbVar13;
          pbVar19 = pbVar19 + 1;
          iVar6 = isdigit((uint)pbVar13[1]);
          pbVar13 = pbVar13 + 1;
        }
        *pbVar14 = 0;
        uVar7 = atoi((char *)__nptr);
        uVar16 = (ulong)uVar7;
        if (-1 < (int)uVar7) goto LAB_00315684;
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0031625e;
        SetLastError(0x54f);
        bVar21 = true;
        uVar18 = 0xffffffff;
        iVar6 = local_43c;
        iVar5 = -1;
        goto LAB_00315ebf;
      }
      local_448 = 0xffffffff;
      uVar16 = local_448;
LAB_00315684:
      local_448 = uVar16;
      iVar6 = local_43c;
      pbVar17 = (byte *)(TempBuff + 0x3f8);
      bVar4 = *pbVar13;
      iVar5 = (uint)(bVar4 == 0x70) * 4 + -1;
      pbVar14 = pbVar13;
      if (bVar4 < 0x68) {
        if (bVar4 == 0x49) {
          if ((pbVar13[1] == 0x36) && (pbVar13[2] == 0x34)) {
            iVar5 = 3;
            pbVar14 = pbVar13 + 3;
          }
        }
        else if (bVar4 == 0x4c) {
          pbVar14 = pbVar13 + 1;
        }
      }
      else if (bVar4 == 0x68) {
        iVar5 = 1;
        pbVar14 = pbVar13 + 1;
      }
      else if ((bVar4 == 0x6c) || (bVar4 == 0x77)) {
        if ((pbVar13[1] | 0x10) == 0x73) {
          iVar5 = 2;
        }
        pbVar14 = pbVar13 + 1;
        if (pbVar13[1] == 0x6c) {
          iVar5 = 3;
          pbVar14 = pbVar13 + 2;
        }
      }
      bVar4 = *pbVar14;
      Format = (LPCSTR)pbVar14;
      if (bVar4 < 0x53) {
        if (bVar4 == 0x43) goto switchD_003157e1_caseD_63;
        if ((bVar4 == 0x45) || (bVar4 == 0x47)) goto switchD_003157e1_caseD_65;
        goto switchD_003157e1_caseD_59;
      }
      switch(bVar4) {
      case 0x58:
      case 100:
      case 0x69:
      case 0x6f:
      case 0x70:
      case 0x75:
      case 0x78:
        if (iVar5 == 3) {
          local_450 = CONCAT44(local_450._4_4_,3);
          if (pbVar19 < &local_438 || pbVar17 <= pbVar19) {
            SetLastError(0x7a);
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_0031625e;
          }
          else {
            eVar8 = strcpy_s((char *)pbVar19,(long)pbVar17 - (long)pbVar19,"ll");
            if (eVar8 == 0) {
              sVar10 = strlen("ll");
              pbVar19 = pbVar19 + sVar10;
              iVar5 = (int)local_450;
              goto LAB_0031590d;
            }
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_0031625e;
            SetLastError(0x7a);
          }
          bVar21 = true;
          uVar18 = 3;
          uVar16 = local_448;
          iVar6 = local_43c;
          iVar5 = (int)local_450;
          goto LAB_00315ebf;
        }
        if (iVar5 == 2) {
          if (&local_438 <= pbVar19 && pbVar19 < pbVar17) {
            *pbVar19 = 0x6c;
LAB_0031590a:
            pbVar19 = pbVar19 + 1;
            goto LAB_0031590d;
          }
        }
        else if (iVar5 == 1) {
          if (&local_438 <= pbVar19 && pbVar19 < pbVar17) {
            *pbVar19 = 0x68;
            goto LAB_0031590a;
          }
        }
        else {
LAB_0031590d:
          if (&local_438 <= pbVar19 && pbVar19 < pbVar17) {
            bVar4 = *pbVar14;
            pbVar14 = pbVar14 + 1;
            *pbVar19 = bVar4;
            pbVar13 = pbVar19 + 1;
            local_450 = 3;
            goto LAB_00315b18;
          }
        }
        SetLastError(0x7a);
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0031625e;
        uVar18 = 3;
        iVar6 = local_43c;
        break;
      case 0x59:
      case 0x5a:
      case 0x5c:
      case 0x5d:
      case 0x5e:
      case 0x5f:
      case 0x60:
      case 0x61:
      case 0x62:
      case 0x68:
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x6d:
      case 0x71:
      case 0x72:
      case 0x74:
      case 0x76:
      case 0x77:
        goto switchD_003157e1_caseD_59;
      case 0x5b:
        if (pbVar19 < &local_438 || pbVar17 <= pbVar19) {
LAB_00315e8a:
          SetLastError(0x7a);
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_0031625e;
          uVar18 = 0xffffffff;
          Format = (LPCSTR)pbVar14;
          iVar6 = local_43c;
        }
        else {
          pbVar13 = pbVar19 + 1;
          *pbVar19 = 0x5b;
          Format = (LPCSTR)(pbVar14 + 1);
          if (pbVar14[1] == 0x5e) {
            if (pbVar13 < &local_438 || TempBuff + 0x3f8 <= pbVar13) {
              SetLastError(0x7a);
              if (PAL_InitializeChakraCoreCalled == false) goto LAB_0031625e;
              uVar18 = 0xffffffff;
              iVar6 = local_43c;
              break;
            }
            pbVar19[1] = 0x5e;
            pbVar13 = pbVar19 + 2;
            Format = (LPCSTR)(pbVar14 + 2);
          }
          pbVar14 = (byte *)Format;
          pbVar19 = (byte *)(TempBuff + 0x3f8);
          if (*pbVar14 != 0x5d) {
LAB_00315c88:
            if (*pbVar14 == 0x2d) {
              if (pbVar13 < &local_438 || pbVar19 <= pbVar13) goto LAB_00315dee;
              *pbVar13 = 0x2d;
              pbVar13 = pbVar13 + 1;
              pbVar14 = pbVar14 + 1;
            }
LAB_00315caf:
            do {
              bVar4 = *pbVar14;
              if (bVar4 != 0x2d) {
                if (bVar4 != 0) {
                  if (bVar4 != 0x5d) {
                    if ((pbVar13 < &local_438) || (pbVar19 <= pbVar13)) goto LAB_00315e39;
                    *pbVar13 = bVar4;
                    pbVar13 = pbVar13 + 1;
                    pbVar14 = pbVar14 + 1;
                    goto LAB_00315caf;
                  }
                  if (pbVar13 < &local_438 || pbVar19 <= pbVar13) goto LAB_00315e8a;
                  *pbVar13 = 0x5d;
                  pbVar13 = pbVar13 + 1;
                  pbVar14 = pbVar14 + 1;
                }
                local_450 = 6;
                goto LAB_00315b18;
              }
              bVar4 = pbVar14[1];
              if (bVar4 == 0x5d) {
                if ((pbVar13 < &local_438) || (pbVar19 <= pbVar13)) {
LAB_00315e39:
                  SetLastError(0x7a);
                  iVar6 = local_43c;
                  goto joined_r0x00315e57;
                }
                pbVar14 = pbVar14 + 1;
                *pbVar13 = 0x2d;
                pbVar13 = pbVar13 + 1;
                goto LAB_00315caf;
              }
              bVar1 = pbVar14[-1];
              if (bVar4 < bVar1) {
                pbVar17 = pbVar13 + -1;
                if (&local_438 <= pbVar17 && pbVar17 < pbVar19) {
                  *pbVar17 = bVar4;
                  bVar4 = bVar1;
                  goto LAB_00315d3a;
                }
LAB_00315d72:
                SetLastError(0x7a);
                if (PAL_InitializeChakraCoreCalled == false) goto LAB_0031625e;
                bVar21 = false;
              }
              else {
LAB_00315d3a:
                if (pbVar13 < &local_438 || pbVar19 <= pbVar13) goto LAB_00315d72;
                pbVar17 = pbVar13 + 1;
                *pbVar13 = 0x2d;
                if (pbVar17 < &local_438 || pbVar19 <= pbVar17) {
                  local_450 = CONCAT44(local_450._4_4_,iVar5);
                  SetLastError(0x7a);
                  if (PAL_InitializeChakraCoreCalled == false) goto LAB_0031625e;
                  bVar21 = false;
                  pbVar13 = pbVar17;
                  iVar5 = (int)local_450;
                }
                else {
                  pbVar13[1] = bVar4;
                  pbVar14 = pbVar14 + 2;
                  bVar21 = true;
                  pbVar13 = pbVar13 + 2;
                }
              }
              uVar16 = local_448;
              iVar6 = local_43c;
            } while (bVar21);
            goto LAB_0031563b;
          }
          if (&local_438 <= pbVar13 && pbVar13 < pbVar19) {
            *pbVar13 = 0x5d;
            pbVar13 = pbVar13 + 1;
            pbVar14 = pbVar14 + 1;
            goto LAB_00315c88;
          }
LAB_00315dee:
          SetLastError(0x7a);
joined_r0x00315e57:
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_0031625e;
          uVar18 = 0xffffffff;
          Format = (LPCSTR)pbVar14;
        }
        break;
      case 99:
switchD_003157e1_caseD_63:
        iVar6 = iVar5;
        if (bVar4 == 0x43) {
          iVar6 = 2;
        }
        if (iVar5 != 1) {
          iVar5 = iVar6;
        }
        if (iVar5 == 2) {
          if (&local_438 <= pbVar19 && pbVar19 < pbVar17) {
            *pbVar19 = 0x6c;
            pbVar19 = pbVar19 + 1;
            goto LAB_003158ce;
          }
        }
        else {
LAB_003158ce:
          if (&local_438 <= pbVar19 && pbVar19 < pbVar17) {
            *pbVar19 = 99;
            pbVar13 = pbVar19 + 1;
            pbVar14 = pbVar14 + 1;
            local_450 = 1;
            goto LAB_00315b18;
          }
        }
        SetLastError(0x7a);
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0031625e;
        uVar18 = 1;
        iVar6 = local_43c;
        break;
      case 0x65:
      case 0x66:
      case 0x67:
switchD_003157e1_caseD_65:
        if (&local_438 <= pbVar19 && pbVar19 < pbVar17) {
          pbVar14 = pbVar14 + 1;
          iVar6 = tolower((int)(char)bVar4);
          *pbVar19 = (byte)iVar6;
          pbVar19 = pbVar19 + 1;
          local_450 = 5;
          bVar21 = false;
          goto LAB_00315b21;
        }
        SetLastError(0x7a);
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0031625e;
        uVar18 = 5;
        iVar6 = local_43c;
        break;
      case 0x6e:
        if (iVar5 == 1) {
          if (pbVar19 < &local_438 || pbVar17 <= pbVar19) goto LAB_00315e8a;
          *pbVar19 = 0x68;
          pbVar19 = pbVar19 + 1;
        }
        if (pbVar19 < &local_438 || pbVar17 <= pbVar19) goto LAB_00315e8a;
        bVar4 = *pbVar14;
        pbVar14 = pbVar14 + 1;
        *pbVar19 = bVar4;
        pbVar13 = pbVar19 + 1;
        local_450 = 4;
LAB_00315b18:
        bVar21 = false;
        pbVar19 = pbVar13;
        goto LAB_00315b21;
      case 0x73:
switchD_003157e1_caseD_73:
        iVar6 = iVar5;
        if (bVar4 == 0x53) {
          iVar6 = 2;
        }
        if (iVar5 != 1) {
          iVar5 = iVar6;
        }
        if (iVar5 == 2) {
          if (&local_438 <= pbVar19 && pbVar19 < pbVar17) {
            *pbVar19 = 0x6c;
            pbVar19 = pbVar19 + 1;
            goto LAB_00315a10;
          }
        }
        else {
LAB_00315a10:
          if (&local_438 <= pbVar19 && pbVar19 < pbVar17) {
            *pbVar19 = 0x73;
            pbVar13 = pbVar19 + 1;
            pbVar14 = pbVar14 + 1;
            local_450 = 2;
            goto LAB_00315b18;
          }
        }
        SetLastError(0x7a);
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0031625e;
        uVar18 = 2;
        iVar6 = local_43c;
        break;
      default:
        if (bVar4 == 0x53) goto switchD_003157e1_caseD_73;
        goto switchD_003157e1_caseD_59;
      }
      bVar21 = true;
      uVar16 = local_448;
LAB_00315ebf:
      iVar15 = (int)uVar16;
      local_450 = uVar18;
      if (bVar21) {
LAB_00315ecd:
        if ((*Format != *string) || ((int)local_450 == 7)) break;
        string = string + 1;
LAB_00315eeb:
        Format = (LPCSTR)((byte *)Format + 1);
      }
      else {
        uVar7 = (uint)uVar18;
        if ((iVar5 == 2) && (uVar7 - 1 < 2)) {
          bVar21 = iVar15 == -1 && uVar7 == 1;
          uVar18 = (ulong)bVar21;
          uVar16 = uVar16 & 0xffffffff;
          if (iVar15 == -1 && uVar7 == 1) {
            uVar16 = 1;
          }
          uVar7 = (uint)bVar21;
          uVar20 = uVar18;
          local_43c = iVar6;
          if (string[uVar18] != 0) {
            local_448 = uVar16;
            iVar6 = isspace((uint)string[uVar18]);
            if ((iVar6 == 0) && ((int)uVar16 == -1 || (int)uVar7 < (int)local_448)) {
              while( true ) {
                uVar7 = uVar7 + 1;
                uVar20 = (ulong)uVar7;
                uVar18 = (ulong)(int)uVar7;
                if (string[uVar18] == 0) break;
                iVar5 = (int)local_448;
                iVar6 = isspace((uint)string[uVar18]);
                if ((iVar6 != 0) || (iVar5 != -1 && (int)local_448 <= (int)uVar7)) break;
              }
            }
          }
          bVar21 = true;
          pbVar14 = string + uVar18;
          iVar6 = local_43c;
          if (local_454 != 0) {
            uVar7 = p_Stack_460->gp_offset;
            if ((ulong)uVar7 < 0x29) {
              puVar11 = (undefined8 *)((ulong)uVar7 + (long)p_Stack_460->reg_save_area);
              p_Stack_460->gp_offset = uVar7 + 8;
            }
            else {
              puVar11 = (undefined8 *)p_Stack_460->overflow_arg_area;
              p_Stack_460->overflow_arg_area = puVar11 + 1;
            }
            lpWideCharStr = (LPWSTR)*puVar11;
            iVar6 = MultiByteToWideChar(0,0,(LPCSTR)string,(int)uVar20,lpWideCharStr,(int)uVar20);
            if (iVar6 == 0) {
              fprintf(_stderr,"] %s %s:%d","PAL_vsscanf",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printf.cpp"
                      ,0x484);
              __stream = _stderr;
              DVar9 = GetLastError();
              fprintf(__stream,"MultiByteToWideChar failed.  Error is %d\n",(ulong)DVar9);
              bVar21 = false;
              pbVar14 = string;
              iVar6 = local_43c;
            }
            else {
              if ((int)local_450 == 2) {
                lpWideCharStr[iVar6] = L'\0';
              }
              bVar21 = true;
              iVar6 = local_43c + 1;
            }
          }
          string = pbVar14;
          if (!bVar21) {
LAB_00316234:
            iVar6 = -1;
            break;
          }
        }
        else if (uVar7 == 4) {
          uVar7 = p_Stack_460->gp_offset;
          local_478 = (int)Buffer;
          if (iVar5 == 1) {
            if (uVar7 < 0x29) {
              puVar11 = (undefined8 *)((ulong)uVar7 + (long)p_Stack_460->reg_save_area);
              p_Stack_460->gp_offset = uVar7 + 8;
            }
            else {
              puVar11 = (undefined8 *)p_Stack_460->overflow_arg_area;
              p_Stack_460->overflow_arg_area = puVar11 + 1;
            }
            *(short *)*puVar11 = (short)string - (short)Buffer;
          }
          else {
            if (uVar7 < 0x29) {
              puVar11 = (undefined8 *)((ulong)uVar7 + (long)p_Stack_460->reg_save_area);
              p_Stack_460->gp_offset = uVar7 + 8;
            }
            else {
              puVar11 = (undefined8 *)p_Stack_460->overflow_arg_area;
              p_Stack_460->overflow_arg_area = puVar11 + 1;
            }
            *(int *)*puVar11 = (int)string - local_478;
          }
        }
        else {
          if (local_454 == 0) {
            iVar5 = sscanf_s((char *)string,(char *)&local_438,&local_464);
          }
          else {
            uVar2 = p_Stack_460->gp_offset;
            if ((ulong)uVar2 < 0x29) {
              puVar11 = (undefined8 *)((ulong)uVar2 + (long)p_Stack_460->reg_save_area);
              p_Stack_460->gp_offset = uVar2 + 8;
            }
            else {
              puVar11 = (undefined8 *)p_Stack_460->overflow_arg_area;
              p_Stack_460->overflow_arg_area = puVar11 + 1;
            }
            uVar3 = *puVar11;
            if ((uVar7 & 0xfffffffb) == 2) {
              if (iVar15 < 1) {
                sVar10 = strlen(Buffer);
                iVar15 = (int)sVar10;
              }
              uVar18 = (ulong)(iVar15 + 1);
            }
            else {
              uVar18 = 0;
              if ((uVar7 == 1) && (uVar18 = uVar16 & 0xffffffff, iVar15 < 2)) {
                uVar18 = 1;
              }
            }
            if ((int)uVar18 == 0) {
              iVar5 = sscanf_s((char *)string,(char *)&local_438,uVar3,&local_464);
            }
            else {
              iVar5 = sscanf_s((char *)string,(char *)&local_438,uVar3,uVar18,&local_464);
            }
          }
          iVar15 = 0;
          iVar12 = 0;
          if (0 < iVar5) {
            iVar15 = iVar5;
            iVar12 = local_464;
          }
          iVar6 = iVar6 + iVar15;
          if (iVar5 < 1) break;
          string = string + iVar12;
        }
      }
      bVar4 = *Format;
    } while (bVar4 != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == TempBuff._1016_8_) {
    return iVar6;
  }
  __stack_chk_fail();
switchD_003157e1_caseD_59:
  local_450 = (ulong)((uint)(bVar4 == 0x20) * 8 - 1);
  bVar21 = true;
LAB_00315b21:
  pbVar13 = (byte *)(TempBuff + 0x3f8);
  Format = (LPCSTR)pbVar14;
  if ((pbVar19 < &local_438 || pbVar13 <= pbVar19) ||
     (*pbVar19 = 0x25, pbVar19 + 1 < &local_438 || pbVar13 <= pbVar19 + 1)) {
    SetLastError(0x7a);
LAB_00315bc2:
    bVar21 = true;
    uVar18 = local_450;
    uVar16 = local_448;
    iVar6 = local_43c;
    if (PAL_InitializeChakraCoreCalled == false) {
LAB_0031625e:
      abort();
    }
  }
  else {
    pbVar19[1] = 0x6e;
    pbVar19 = pbVar19 + 2;
    if (pbVar19 < &local_438 || pbVar13 <= pbVar19) {
      SetLastError(0x7a);
      goto LAB_00315bc2;
    }
    *pbVar19 = 0;
    PAL_free(__nptr);
    uVar18 = local_450;
    uVar16 = local_448;
    iVar6 = local_43c;
  }
  goto LAB_00315ebf;
}

Assistant:

__attribute__((no_instrument_function))
int PAL_vsscanf(LPCSTR Buffer, LPCSTR Format, va_list ap)
{
    INT Length = 0;
    LPCSTR Buff = Buffer;
    LPCSTR Fmt = Format;
    CHAR TempBuff[1024]; /* used to hold a single %<foo> format string */
    BOOL Store;
    INT Width;
    INT Prefix;
    INT Type = -1;

    while (*Fmt)
    {
        if (!*Buff && Length == 0)
        {
            Length = EOF;
            break;
        }
        /* remove any number of blanks */
        else if (isspace((unsigned char) *Fmt))
        {
            while (isspace((unsigned char) *Buff))
            {
                ++Buff;
            }
            ++Fmt;
        }
        else if (*Fmt == '%' &&
                 Internal_ScanfExtractFormatA(&Fmt, TempBuff, sizeof(TempBuff), &Store,
                                              &Width, &Prefix, &Type))
        {
            if (Prefix == SCANF_PREFIX_LONG &&
                (Type == SCANF_TYPE_STRING || Type == SCANF_TYPE_CHAR))
            {
                int len = 0;
                int res;
                WCHAR *charPtr = 0;

                /* a single character */
                if (Type == SCANF_TYPE_CHAR && Width == -1)
                {
                    len = Width = 1;
                }

                /* calculate length of string to copy */
                while (Buff[len] && !isspace((unsigned char) Buff[len]))
                {
                    if (Width != -1 && len >= Width)
                    {
                        break;
                    }
                    ++len;
                }

                if (Store)
                {
                    charPtr = va_arg(ap, WCHAR *);

                    res = MultiByteToWideChar(CP_ACP, 0, Buff, len,
                                            charPtr, len);
                    if (!res)
                    {
                        ASSERT("MultiByteToWideChar failed.  Error is %d\n",
                            GetLastError());
                        return -1;
                    }
                    if (Type == SCANF_TYPE_STRING)
                    {
                        /* end string */
                        charPtr[res] = 0;
                    }
                    ++Length;
                }
                Buff += len;
            }
            /* this places the number of bytes stored into the next arg */
            else if (Type == SCANF_TYPE_N)
            {
                if (Prefix == SCANF_PREFIX_SHORT)
                {
                    *(va_arg(ap, short *)) = Buff - Buffer;
                }
                else
                {
                    *(va_arg(ap, LPLONG)) = Buff - Buffer;
                }
            }
            /* types that sscanf can handle */
            else
            {
                int ret;
                int n;
                LPVOID voidPtr = NULL;

                if (Store)
                {
                    // sscanf_s requires that if we are trying to read "%s" or "%c" or "%[", then
                    // the size of the buffer must follow the buffer we are trying to read into.
                    voidPtr = va_arg(ap, LPVOID);
                    unsigned typeLen = 0;
                    if ((Type == SCANF_TYPE_STRING) || (Type == SCANF_TYPE_BRACKETS))
                    {
                        // Since this is not a Safe CRT API we don't really know the size of the destination
                        // buffer provided by the caller. So we have to assume that the caller has allocated
                        // enough space to hold either the width specified in the format or the entire input
                        // string plus '\0'.
                        typeLen = ((Width > 0) ? Width : strlen(Buffer)) + 1;
                    }
                    else if (Type == SCANF_TYPE_CHAR)
                    {
                        // Check whether the format string contains number of characters
                        // that should be read from the input string.
                        // Note: '\0' does not get appended in the "%c" case.
                        typeLen = (Width > 0) ? Width : 1;
                    }

                    if (typeLen > 0)
                    {
                        ret = sscanf_s(Buff, TempBuff, voidPtr, typeLen, &n);
                    }
                    else
                    {
                        ret = sscanf_s(Buff, TempBuff, voidPtr, &n);
                    }
                }
                else
                {
                    ret = sscanf_s(Buff, TempBuff, &n);
                }

#if SSCANF_CANNOT_HANDLE_MISSING_EXPONENT
                if ((ret == 0) && (Type == SCANF_TYPE_FLOAT))
                {
                    ret = SscanfFloatCheckExponent(Buff, TempBuff, voidPtr, &n);
                }
#endif // SSCANF_CANNOT_HANDLE_MISSING_EXPONENT

                if (ret > 0)
                {
                    Length += ret;
                }
                else
                {
                    /* no match, break scan */
                    break;
                }
                Buff += n;
            }
        }
        else
        {
            /* grab, but not store */
            if (*Fmt == *Buff && Type != SCANF_TYPE_SPACE)
            {
                ++Fmt;
                ++Buff;
            }
            /* doesn't match, break scan */
            else
            {
                break;
            }
        }
    }

    return Length;
}